

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall NeuralConsumer::initialize(NeuralConsumer *this)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  HFSubConsumer *in_RDI;
  int *i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  int prev;
  vector<int,_std::allocator<int>_> new_indices;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  size_type *local_30;
  int local_24;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3429cd);
  local_24 = -2;
  local_30 = &in_RDI[1].super_HighFreqSub.dt.name._M_string_length;
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff98);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    if (*piVar2 - local_24 == 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)in_RDI);
      *pvVar3 = *pvVar3 + 1;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffffb0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffa8 = 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_RDI,
                 (value_type_conflict *)in_stack_ffffffffffffff98);
    }
    local_24 = *piVar2;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
  }
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000040,__range1);
  HFSubConsumer::initialize(in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void NeuralConsumer::initialize(){
    std::vector<int> new_indices;
    int prev = -2;
    for(auto const &i : args.indices){
        if(i-prev == 1){//If i is right after previous index
            new_indices.back()++;
        }
        else{//else its a new separate grouping
            new_indices.push_back(i);
            new_indices.push_back(1);
        }
        prev = i;
    }
    // for(auto const &i:new_indices) std::cout << "-" << i;
    // std::cout << std::endl;
    args.indices = new_indices;
    HFSubConsumer::initialize();
}